

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6d004::CommandTask::provideValue
          (CommandTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,ValueType *valueData)

{
  Command *pCVar1;
  _func_int *p_Var2;
  BuildEngineDelegate *pBVar3;
  BinaryDecoder local_b8;
  void *local_a0;
  CommandSignature local_98;
  
  pCVar1 = this->command;
  local_a0 = ti.impl;
  local_98.value = (uint64_t)ti.ctx;
  pBVar3 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_a0);
  p_Var2 = *pBVar3[1]._vptr_BuildEngineDelegate;
  local_b8.data.Data =
       (char *)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
  local_b8.data.Length =
       (long)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)local_b8.data.Data;
  local_b8.pos = 0;
  llbuild::buildsystem::BuildValue::BuildValue((BuildValue *)&local_a0,&local_b8);
  (*(pCVar1->super_JobDescriptor)._vptr_JobDescriptor[0x11])
            (pCVar1,p_Var2,ti.impl,ti.ctx,inputID,key,(BuildValue *)&local_a0);
  llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_a0);
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    command.provideValue(getBuildSystem(ti).getBuildSystem(), ti, inputID,
                         key, BuildValue::fromData(valueData));
  }